

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int runC(lua_State *L,lua_State *L1,char *pc)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  lua_CFunction p_Var7;
  char *r;
  size_t sVar8;
  ulong uVar9;
  void *pvVar10;
  char *pcVar11;
  char *pcVar12;
  lua_State *plVar13;
  lua_State *to;
  code *pcVar14;
  lua_KContext lVar15;
  uint uVar16;
  bool bVar17;
  undefined8 uVar19;
  undefined1 auVar18 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  int local_184;
  char *pc_local;
  int local_16c;
  char buff [300];
  
  pc_local = pc;
  if (pc == (char *)0x0) {
    iVar3 = luaL_error(L,"attempt to runC null script");
    return iVar3;
  }
  local_184 = 0;
LAB_00131c12:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  while( true ) {
                                    while( true ) {
                                      getstring_aux(L,buff,&pc_local);
                                      if (buff[0] == '\0') {
                                        return 0;
                                      }
                                      iVar3 = bcmp("absindex",buff,9);
                                      if (iVar3 != 0) break;
                                      iVar3 = getindex_aux(L,L1,&pc_local);
                                      iVar3 = lua_absindex(L1,iVar3);
                                      in_ZMM0 = ZEXT1664(CONCAT88(in_XMM1_Qb,(double)iVar3));
                                      lua_pushnumber(L1,(double)iVar3);
                                    }
                                    iVar3 = bcmp("append",buff,7);
                                    if (iVar3 != 0) break;
                                    iVar3 = getindex_aux(L,L1,&pc_local);
                                    sVar8 = lua_rawlen(L1,iVar3);
                                    lua_rawseti(L1,iVar3,(long)((int)sVar8 + 1));
                                  }
                                  iVar3 = bcmp("arith",buff,6);
                                  if (iVar3 != 0) break;
                                  skip(&pc_local);
                                  cVar1 = *pc_local;
                                  pc_local = pc_local + 1;
                                  pvVar10 = memchr("+-*%^/\\&|~<>_!",(int)cVar1,0xf);
                                  lua_arith(L1,(int)pvVar10 + -0x154448);
                                }
                                iVar3 = bcmp("call",buff,5);
                                if (iVar3 != 0) break;
                                iVar3 = getnum_aux(L,L1,&pc_local);
                                iVar4 = getnum_aux(L,L1,&pc_local);
                                lua_callk(L1,iVar3,iVar4,0,(lua_KFunction)0x0);
                              }
                              iVar3 = bcmp("callk",buff,6);
                              if (iVar3 != 0) break;
                              iVar3 = getnum_aux(L,L1,&pc_local);
                              iVar4 = getnum_aux(L,L1,&pc_local);
                              iVar5 = getindex_aux(L,L1,&pc_local);
                              lua_callk(L1,iVar3,iVar4,(long)iVar5,Cfunck);
                            }
                            iVar3 = bcmp("checkstack",buff,0xb);
                            if (iVar3 != 0) break;
                            iVar3 = getnum_aux(L,L1,&pc_local);
                            getstring_aux(L,buff,&pc_local);
                            pcVar12 = (char *)0x0;
                            if (buff[0] != '\0') {
                              pcVar12 = buff;
                            }
                            luaL_checkstack(L1,iVar3,pcVar12);
                          }
                          lVar2 = CONCAT62(buff._2_6_,CONCAT11(buff[1],buff[0]));
                          if (lVar2 == 0x657261706d6f63) {
                            getstring_aux(L,buff,&pc_local);
                            iVar3 = (buff[1] != 'T') + 1;
                            if (buff[0] == 'E') {
                              iVar3 = 0;
                            }
                            iVar4 = getindex_aux(L,L1,&pc_local);
                            iVar5 = getindex_aux(L,L1,&pc_local);
                            uVar6 = lua_compare(L1,iVar4,iVar5,iVar3);
                            goto LAB_00131d39;
                          }
                          iVar3 = bcmp("concat",buff,7);
                          if (iVar3 != 0) break;
                          iVar3 = getnum_aux(L,L1,&pc_local);
                          lua_concat(L1,iVar3);
                        }
                        iVar3 = bcmp("copy",buff,5);
                        if (iVar3 != 0) break;
                        iVar3 = getindex_aux(L,L1,&pc_local);
                        iVar4 = getindex_aux(L,L1,&pc_local);
                        lua_copy(L1,iVar3,iVar4);
                      }
                      iVar3 = bcmp("func2num",buff,9);
                      if (iVar3 != 0) break;
                      iVar3 = getindex_aux(L,L1,&pc_local);
                      p_Var7 = lua_tocfunction(L1,iVar3);
                      auVar18._8_8_ = in_XMM1_Qb;
                      auVar18._0_8_ = in_XMM1_Qa;
                      auVar18 = vcvtusi2sd_avx512f(auVar18,p_Var7);
                      in_ZMM0 = ZEXT1664(auVar18);
                      lua_pushnumber(L1,auVar18._0_8_);
                    }
                    iVar3 = bcmp("getfield",buff,9);
                    if (iVar3 != 0) break;
                    iVar3 = getindex_aux(L,L1,&pc_local);
                    getstring_aux(L,buff,&pc_local);
                    lua_getfield(L1,iVar3,buff);
                  }
                  iVar3 = bcmp("getglobal",buff,10);
                  if (iVar3 != 0) break;
                  getstring_aux(L,buff,&pc_local);
                  lua_getglobal(L1,buff);
                }
                iVar3 = bcmp("getmetatable",buff,0xd);
                if (iVar3 != 0) break;
                iVar3 = getindex_aux(L,L1,&pc_local);
                iVar3 = lua_getmetatable(L1,iVar3);
                if (iVar3 == 0) {
                  lua_pushnil(L1);
                }
              }
              iVar3 = bcmp("gettable",buff,9);
              if (iVar3 != 0) break;
              iVar3 = getindex_aux(L,L1,&pc_local);
              lua_gettable(L1,iVar3);
            }
            iVar3 = bcmp("gettop",buff,7);
            if (iVar3 != 0) break;
            iVar3 = lua_gettop(L1);
            lua_pushinteger(L1,(long)iVar3);
          }
          iVar3 = bcmp("gsub",buff,5);
          if (iVar3 != 0) break;
          iVar3 = getnum_aux(L,L1,&pc_local);
          iVar4 = getnum_aux(L,L1,&pc_local);
          local_16c = getnum_aux(L,L1,&pc_local);
          pcVar12 = lua_tolstring(L1,iVar3,(size_t *)0x0);
          pcVar11 = lua_tolstring(L1,iVar4,(size_t *)0x0);
          r = lua_tolstring(L1,local_16c,(size_t *)0x0);
          luaL_gsub(L1,pcVar12,pcVar11,r);
        }
        iVar3 = bcmp("insert",buff,7);
        if (iVar3 != 0) break;
        iVar3 = getnum_aux(L,L1,&pc_local);
        lua_rotate(L1,iVar3,1);
      }
      iVar3 = bcmp("iscfunction",buff,0xc);
      if (iVar3 == 0) {
        iVar3 = getindex_aux(L,L1,&pc_local);
        uVar6 = lua_iscfunction(L1,iVar3);
        goto LAB_00131d39;
      }
      iVar3 = bcmp("isfunction",buff,0xb);
      if (iVar3 != 0) break;
      iVar3 = getindex_aux(L,L1,&pc_local);
      iVar3 = lua_type(L1,iVar3);
      bVar17 = iVar3 == 6;
LAB_0013230e:
      uVar6 = (uint)bVar17;
LAB_00131d39:
      lua_pushboolean(L1,uVar6);
    }
    iVar3 = bcmp("isnil",buff,6);
    if (iVar3 == 0) {
      iVar3 = getindex_aux(L,L1,&pc_local);
      iVar3 = lua_type(L1,iVar3);
      bVar17 = iVar3 == 0;
      goto LAB_0013230e;
    }
    iVar3 = bcmp("isnull",buff,7);
    if (iVar3 == 0) {
      iVar3 = getindex_aux(L,L1,&pc_local);
      iVar3 = lua_type(L1,iVar3);
      bVar17 = iVar3 == -1;
      goto LAB_0013230e;
    }
    iVar3 = bcmp("isnumber",buff,9);
    if (iVar3 == 0) {
      iVar3 = getindex_aux(L,L1,&pc_local);
      uVar6 = lua_isnumber(L1,iVar3);
      goto LAB_00131d39;
    }
    iVar3 = bcmp("isstring",buff,9);
    if (iVar3 == 0) {
      iVar3 = getindex_aux(L,L1,&pc_local);
      uVar6 = lua_isstring(L1,iVar3);
      goto LAB_00131d39;
    }
    if (lVar2 == 0x656c6261747369) {
      iVar3 = getindex_aux(L,L1,&pc_local);
      iVar3 = lua_type(L1,iVar3);
      bVar17 = iVar3 == 5;
      goto LAB_0013230e;
    }
    iVar3 = bcmp("isudataval",buff,0xb);
    if (iVar3 == 0) {
      iVar3 = getindex_aux(L,L1,&pc_local);
      iVar3 = lua_type(L1,iVar3);
      bVar17 = iVar3 == 2;
      goto LAB_0013230e;
    }
    iVar3 = bcmp("isuserdata",buff,0xb);
    if (iVar3 == 0) {
      iVar3 = getindex_aux(L,L1,&pc_local);
      uVar6 = lua_isuserdata(L1,iVar3);
      goto LAB_00131d39;
    }
    if ((int)lVar2 != 0x6e656c) {
      iVar3 = bcmp("Llen",buff,5);
      if (iVar3 == 0) {
        iVar3 = getindex_aux(L,L1,&pc_local);
        sVar8 = luaL_len(L1,iVar3);
LAB_00132518:
        lua_pushinteger(L1,sVar8);
      }
      else {
        iVar3 = bcmp("loadfile",buff,9);
        if (iVar3 == 0) {
          iVar3 = getnum_aux(L,L1,&pc_local);
          pcVar12 = luaL_checklstring(L1,iVar3,(size_t *)0x0);
          luaL_loadfilex(L1,pcVar12,(char *)0x0);
        }
        else {
          iVar3 = bcmp("loadstring",buff,0xb);
          if (iVar3 == 0) {
            iVar3 = getnum_aux(L,L1,&pc_local);
            pcVar12 = luaL_checklstring(L1,iVar3,(size_t *)0x0);
            luaL_loadstring(L1,pcVar12);
          }
          else {
            iVar3 = bcmp("newmetatable",buff,0xd);
            if (iVar3 == 0) {
              getstring_aux(L,buff,&pc_local);
              uVar6 = luaL_newmetatable(L1,buff);
LAB_0013259b:
              lua_pushboolean(L1,uVar6);
            }
            else {
              iVar3 = bcmp("newtable",buff,9);
              if (iVar3 == 0) {
                lua_createtable(L1,0,0);
              }
              else {
                iVar3 = bcmp("newthread",buff,10);
                if (iVar3 == 0) {
                  lua_newthread(L1);
                }
                else {
                  iVar3 = bcmp("newuserdata",buff,0xc);
                  if (iVar3 == 0) {
                    iVar3 = getnum_aux(L,L1,&pc_local);
                    lua_newuserdata(L1,(long)iVar3);
                  }
                  else {
                    iVar3 = bcmp("next",buff,5);
                    if (iVar3 == 0) {
                      lua_next(L1,-2);
                    }
                    else {
                      if (lVar2 == 0x657a69736a626f) {
                        iVar3 = getindex_aux(L,L1,&pc_local);
                        sVar8 = lua_rawlen(L1,iVar3);
                        goto LAB_00132518;
                      }
                      iVar3 = bcmp("pcall",buff,6);
                      if (iVar3 == 0) {
                        iVar4 = getnum_aux(L,L1,&pc_local);
                        iVar5 = getnum_aux(L,L1,&pc_local);
                        iVar3 = getnum_aux(L,L1,&pc_local);
                        lVar15 = 0;
                        pcVar14 = (lua_KFunction)0x0;
LAB_001326d1:
                        local_184 = lua_pcallk(L1,iVar4,iVar5,iVar3,lVar15,pcVar14);
                      }
                      else {
                        iVar3 = bcmp("pcallk",buff,7);
                        if (iVar3 == 0) {
                          iVar4 = getnum_aux(L,L1,&pc_local);
                          iVar5 = getnum_aux(L,L1,&pc_local);
                          iVar3 = getindex_aux(L,L1,&pc_local);
                          lVar15 = (lua_KContext)iVar3;
                          iVar3 = 0;
                          pcVar14 = Cfunck;
                          goto LAB_001326d1;
                        }
                        if ((int)lVar2 == 0x706f70) {
                          uVar6 = getnum_aux(L,L1,&pc_local);
                          uVar6 = ~uVar6;
LAB_00132643:
                          lua_settop(L1,uVar6);
                        }
                        else {
                          iVar3 = bcmp("printstack",buff,0xb);
                          if (iVar3 == 0) {
                            iVar3 = getnum_aux(L,L1,&pc_local);
                            if (iVar3 != 0) {
                              pcVar12 = luaL_tolstring(L1,iVar3,(size_t *)0x0);
                              puts(pcVar12);
                              goto LAB_001327d6;
                            }
                            uVar6 = lua_gettop(L1);
                            for (uVar16 = 1; uVar16 - (~((int)uVar6 >> 0x1f) & uVar6) != 1;
                                uVar16 = uVar16 + 1) {
                              pcVar12 = luaL_tolstring(L1,uVar16,(size_t *)0x0);
                              printf("%3d: %s\n",(ulong)uVar16,pcVar12);
                              lua_settop(L1,-2);
                            }
                            putchar(10);
                          }
                          else {
                            iVar3 = bcmp("print",buff,6);
                            if (iVar3 == 0) {
                              getstring_aux(L,buff,&pc_local);
                              puts(buff);
                            }
                            else {
                              iVar3 = bcmp("pushbool",buff,9);
                              if (iVar3 == 0) {
                                iVar3 = getnum_aux(L,L1,&pc_local);
LAB_0013280f:
                                lua_pushboolean(L1,iVar3);
                              }
                              else {
                                iVar3 = bcmp("pushcclosure",buff,0xd);
                                uVar19 = in_ZMM0._8_8_;
                                if (iVar3 == 0) {
                                  iVar3 = getnum_aux(L,L1,&pc_local);
                                  pcVar14 = testC;
LAB_00132897:
                                  lua_pushcclosure(L1,pcVar14,iVar3);
                                }
                                else if (lVar2 == 0x6c696e68737570) {
                                  lua_pushnil(L1);
                                }
                                else {
                                  if (lVar2 == 0x6d756e68737570) {
                                    iVar3 = getnum_aux(L,L1,&pc_local);
                                    in_ZMM0 = ZEXT1664(CONCAT88(uVar19,(double)iVar3));
                                    goto LAB_001328c0;
                                  }
                                  if (lVar2 == 0x746e6968737570) {
                                    iVar3 = getnum_aux(L,L1,&pc_local);
LAB_001327a8:
                                    sVar8 = (size_t)iVar3;
                                    goto LAB_00132518;
                                  }
                                  iVar3 = bcmp("pushstatus",buff,0xb);
                                  if (iVar3 == 0) {
                                    pushcode(L1,local_184);
                                  }
                                  else {
                                    iVar3 = bcmp("pushstring",buff,0xb);
                                    if (iVar3 == 0) {
                                      getstring_aux(L,buff,&pc_local);
                                      lua_pushstring(L1,buff);
                                    }
                                    else {
                                      iVar3 = bcmp("pushupvalueindex",buff,0x11);
                                      if (iVar3 == 0) {
                                        iVar3 = getnum_aux(L,L1,&pc_local);
                                        iVar3 = -0xf4628 - iVar3;
                                        goto LAB_001327a8;
                                      }
                                      iVar3 = bcmp("pushvalue",buff,10);
                                      if (iVar3 == 0) {
                                        iVar3 = getindex_aux(L,L1,&pc_local);
                                        lua_pushvalue(L1,iVar3);
                                      }
                                      else {
                                        iVar3 = bcmp("pushfstringI",buff,0xd);
                                        if (iVar3 == 0) {
                                          pcVar12 = lua_tolstring(L,-2,(size_t *)0x0);
                                          uVar9 = lua_tointegerx(L,-1,(int *)0x0);
                                          lua_pushfstring(L1,pcVar12,uVar9 & 0xffffffff);
                                        }
                                        else {
                                          iVar3 = bcmp("pushfstringS",buff,0xd);
                                          if (iVar3 == 0) {
                                            pcVar12 = lua_tolstring(L,-2,(size_t *)0x0);
                                            pcVar11 = lua_tolstring(L,-1,(size_t *)0x0);
LAB_00132ad3:
                                            lua_pushfstring(L1,pcVar12,pcVar11);
                                          }
                                          else {
                                            iVar3 = bcmp("pushfstringP",buff,0xd);
                                            if (iVar3 == 0) {
                                              pcVar12 = lua_tolstring(L,-2,(size_t *)0x0);
                                              pcVar11 = (char *)lua_topointer(L,-1);
                                              goto LAB_00132ad3;
                                            }
                                            if (lVar2 == 0x70746573776172) {
                                              iVar3 = getindex_aux(L,L1,&pc_local);
                                              iVar4 = getnum_aux(L,L1,&pc_local);
                                              lua_rawsetp(L1,iVar3,(void *)(long)iVar4);
                                            }
                                            else if (lVar2 == 0x70746567776172) {
                                              iVar3 = getindex_aux(L,L1,&pc_local);
                                              iVar4 = getnum_aux(L,L1,&pc_local);
                                              lua_rawgetp(L1,iVar3,(void *)(long)iVar4);
                                            }
                                            else if (lVar2 == 0x69746567776172) {
                                              iVar3 = getindex_aux(L,L1,&pc_local);
                                              iVar4 = getnum_aux(L,L1,&pc_local);
                                              lua_rawgeti(L1,iVar3,(long)iVar4);
                                            }
                                            else {
                                              iVar3 = bcmp("remove",buff,7);
                                              if (iVar3 == 0) {
                                                iVar3 = getnum_aux(L,L1,&pc_local);
                                                lua_rotate(L1,iVar3,-1);
LAB_001327d6:
                                                uVar6 = 0xfffffffe;
                                                goto LAB_00132643;
                                              }
                                              if (lVar2 == 0x6563616c706572) {
                                                iVar3 = getindex_aux(L,L1,&pc_local);
                                                lua_copy(L1,-1,iVar3);
                                                goto LAB_001327d6;
                                              }
                                              iVar3 = bcmp("resume",buff,7);
                                              if (iVar3 == 0) {
                                                iVar3 = getindex_aux(L,L1,&pc_local);
                                                plVar13 = lua_tothread(L1,iVar3);
                                                iVar3 = getnum_aux(L,L1,&pc_local);
                                                local_184 = lua_resume(plVar13,L,iVar3);
                                              }
                                              else {
                                                iVar3 = bcmp("return",buff,7);
                                                if (iVar3 == 0) {
                                                  uVar6 = getnum_aux(L,L1,&pc_local);
                                                  if (L1 == L) {
                                                    return uVar6;
                                                  }
                                                  iVar3 = -uVar6;
                                                  uVar16 = ~((int)uVar6 >> 0x1f) & uVar6;
                                                  while (bVar17 = uVar16 != 0, uVar16 = uVar16 - 1,
                                                        bVar17) {
                                                    pcVar12 = lua_tolstring(L1,iVar3,(size_t *)0x0);
                                                    lua_pushstring(L,pcVar12);
                                                    iVar3 = iVar3 + 1;
                                                  }
                                                  return uVar6;
                                                }
                                                iVar3 = bcmp("rotate",buff,7);
                                                if (iVar3 == 0) {
                                                  iVar3 = getindex_aux(L,L1,&pc_local);
                                                  iVar4 = getnum_aux(L,L1,&pc_local);
                                                  lua_rotate(L1,iVar3,iVar4);
                                                }
                                                else {
                                                  iVar3 = bcmp("setfield",buff,9);
                                                  if (iVar3 == 0) {
                                                    iVar3 = getindex_aux(L,L1,&pc_local);
                                                    getstring_aux(L,buff,&pc_local);
                                                    lua_setfield(L1,iVar3,buff);
                                                  }
                                                  else {
                                                    iVar3 = bcmp("setglobal",buff,10);
                                                    if (iVar3 == 0) {
                                                      getstring_aux(L,buff,&pc_local);
                                                      lua_setglobal(L1,buff);
                                                    }
                                                    else if (lVar2 == 0x6b6f6f68746573) {
                                                      iVar3 = getnum_aux(L,L1,&pc_local);
                                                      iVar4 = getnum_aux(L,L1,&pc_local);
                                                      getstring_aux(L,buff,&pc_local);
                                                      sethookaux(L1,iVar3,iVar4,buff);
                                                    }
                                                    else {
                                                      iVar3 = bcmp("setmetatable",buff,0xd);
                                                      if (iVar3 == 0) {
                                                        iVar3 = getindex_aux(L,L1,&pc_local);
                                                        lua_setmetatable(L1,iVar3);
                                                      }
                                                      else {
                                                        iVar3 = bcmp("settable",buff,9);
                                                        if (iVar3 == 0) {
                                                          iVar3 = getindex_aux(L,L1,&pc_local);
                                                          lua_settable(L1,iVar3);
                                                        }
                                                        else {
                                                          iVar3 = bcmp("settop",buff,7);
                                                          if (iVar3 == 0) {
                                                            uVar6 = getnum_aux(L,L1,&pc_local);
                                                            goto LAB_00132643;
                                                          }
                                                          iVar3 = bcmp("testudata",buff,10);
                                                          if (iVar3 == 0) {
                                                            iVar3 = getindex_aux(L,L1,&pc_local);
                                                            getstring_aux(L,buff,&pc_local);
                                                            pvVar10 = luaL_testudata(L1,iVar3,buff);
                                                            uVar6 = (uint)(pvVar10 != (void *)0x0);
                                                            goto LAB_0013259b;
                                                          }
                                                          iVar3 = bcmp("error",buff,6);
                                                          if (iVar3 == 0) {
                                                            lua_error(L1);
                                                          }
                                                          else {
                                                            iVar3 = bcmp("abort",buff,6);
                                                            if (iVar3 == 0) {
                                                              abort();
                                                            }
                                                            iVar3 = bcmp("throw",buff,6);
                                                            if (iVar3 == 0) {
                                                              luaL_error(L1,"C++");
                                                              return 0;
                                                            }
                                                            iVar3 = bcmp("tobool",buff,7);
                                                            if (iVar3 == 0) {
                                                              iVar3 = getindex_aux(L,L1,&pc_local);
                                                              iVar3 = lua_toboolean(L1,iVar3);
                                                              goto LAB_0013280f;
                                                            }
                                                            iVar3 = bcmp("tocfunction",buff,0xc);
                                                            if (iVar3 == 0) {
                                                              iVar3 = getindex_aux(L,L1,&pc_local);
                                                              pcVar14 = lua_tocfunction(L1,iVar3);
                                                              iVar3 = 0;
                                                              goto LAB_00132897;
                                                            }
                                                            iVar3 = bcmp("tointeger",buff,10);
                                                            if (iVar3 == 0) {
                                                              iVar3 = getindex_aux(L,L1,&pc_local);
                                                              sVar8 = lua_tointegerx(L1,iVar3,(int *
                                                  )0x0);
                                                  goto LAB_00132518;
                                                  }
                                                  iVar3 = bcmp("tonumber",buff,9);
                                                  if (iVar3 == 0) {
                                                    iVar3 = getindex_aux(L,L1,&pc_local);
                                                    in_ZMM0._0_8_ =
                                                         lua_tonumberx(L1,iVar3,(int *)0x0);
                                                    in_ZMM0._8_56_ = extraout_var;
LAB_001328c0:
                                                    lua_pushnumber(L1,in_ZMM0._0_8_);
                                                  }
                                                  else {
                                                    iVar3 = bcmp("topointer",buff,10);
                                                    auVar18 = in_ZMM0._0_16_;
                                                    if (iVar3 == 0) {
                                                      iVar3 = getindex_aux(L,L1,&pc_local);
                                                      pvVar10 = lua_topointer(L1,iVar3);
                                                      auVar18 = vcvtusi2sd_avx512f(auVar18,pvVar10);
                                                      in_ZMM0 = ZEXT1664(auVar18);
                                                      goto LAB_001328c0;
                                                    }
                                                    iVar3 = bcmp("tostring",buff,9);
                                                    if (iVar3 == 0) {
                                                      iVar3 = getindex_aux(L,L1,&pc_local);
                                                      pcVar12 = lua_tolstring(L1,iVar3,(size_t *)0x0
                                                                             );
                                                      pcVar11 = lua_pushstring(L1,pcVar12);
                                                      if ((pcVar12 != (char *)0x0 ||
                                                           pcVar11 != (char *)0x0) &&
                                                         (iVar3 = strcmp(pcVar12,pcVar11),
                                                         iVar3 != 0)) {
                                                        __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                                                  ,0x5f3,
                                                  "int runC(lua_State *, lua_State *, const char *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = bcmp("type",buff,5);
                                                    if (iVar3 != 0) {
                                                      iVar3 = bcmp("xmove",buff,6);
                                                      if (iVar3 == 0) {
                                                        iVar3 = getindex_aux(L,L1,&pc_local);
                                                        iVar4 = getindex_aux(L,L1,&pc_local);
                                                        plVar13 = L1;
                                                        if (iVar3 != 0) {
                                                          plVar13 = lua_tothread(L1,iVar3);
                                                        }
                                                        to = L1;
                                                        if (iVar4 != 0) {
                                                          to = lua_tothread(L1,iVar4);
                                                        }
                                                        iVar3 = getnum_aux(L,L1,&pc_local);
                                                        if (iVar3 == 0) {
                                                          iVar3 = lua_gettop(plVar13);
                                                        }
                                                        lua_xmove(plVar13,to,iVar3);
                                                        goto LAB_00131c12;
                                                      }
                                                      iVar3 = bcmp("yield",buff,6);
                                                      if (iVar3 == 0) {
                                                        iVar3 = getnum_aux(L,L1,&pc_local);
                                                        lVar15 = 0;
                                                        pcVar14 = (lua_KFunction)0x0;
                                                      }
                                                      else {
                                                        iVar3 = bcmp("yieldk",buff,7);
                                                        if (iVar3 != 0) {
                                                          luaL_error(L,"unknown instruction %s",buff
                                                                    );
                                                          goto LAB_00131c12;
                                                        }
                                                        iVar3 = getnum_aux(L,L1,&pc_local);
                                                        iVar4 = getindex_aux(L,L1,&pc_local);
                                                        lVar15 = (lua_KContext)iVar4;
                                                        pcVar14 = Cfunck;
                                                      }
                                                      iVar3 = lua_yieldk(L1,iVar3,lVar15,pcVar14);
                                                      return iVar3;
                                                    }
                                                    iVar3 = getnum_aux(L,L1,&pc_local);
                                                    iVar3 = lua_type(L1,iVar3);
                                                    pcVar12 = lua_typename(L1,iVar3);
                                                    lua_pushstring(L1,pcVar12);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00131c12;
    }
    iVar3 = getindex_aux(L,L1,&pc_local);
    lua_len(L1,iVar3);
  } while( true );
}

Assistant:

static int runC (lua_State *L, lua_State *L1, const char *pc) {
  char buff[300];
  int status = 0;
  if (pc == NULL) return luaL_error(L, "attempt to runC null script");
  for (;;) {
    const char *inst = getstring;
    if EQ("") return 0;
    else if EQ("absindex") {
      lua_pushnumber(L1, lua_absindex(L1, getindex));
    }
    else if EQ("append") {
      int t = getindex;
      int i = lua_rawlen(L1, t);
      lua_rawseti(L1, t, i + 1);
    }
    else if EQ("arith") {
      int op;
      skip(&pc);
      op = strchr(ops, *pc++) - ops;
      lua_arith(L1, op);
    }
    else if EQ("call") {
      int narg = getnum;
      int nres = getnum;
      lua_call(L1, narg, nres);
    }
    else if EQ("callk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      lua_callk(L1, narg, nres, i, Cfunck);
    }
    else if EQ("checkstack") {
      int sz = getnum;
      const char *msg = getstring;
      if (*msg == '\0')
        msg = NULL;  /* to test 'luaL_checkstack' with no message */
      luaL_checkstack(L1, sz, msg);
    }
    else if EQ("compare") {
      const char *opt = getstring;  /* EQ, LT, or LE */
      int op = (opt[0] == 'E') ? LUA_OPEQ
                               : (opt[1] == 'T') ? LUA_OPLT : LUA_OPLE;
      int a = getindex;
      int b = getindex;
      lua_pushboolean(L1, lua_compare(L1, a, b, op));
    }
    else if EQ("concat") {
      lua_concat(L1, getnum);
    }
    else if EQ("copy") {
      int f = getindex;
      lua_copy(L1, f, getindex);
    }
    else if EQ("func2num") {
      lua_CFunction func = lua_tocfunction(L1, getindex);
      lua_pushnumber(L1, cast(size_t, func));
    }
    else if EQ("getfield") {
      int t = getindex;
      lua_getfield(L1, t, getstring);
    }
    else if EQ("getglobal") {
      lua_getglobal(L1, getstring);
    }
    else if EQ("getmetatable") {
      if (lua_getmetatable(L1, getindex) == 0)
        lua_pushnil(L1);
    }
    else if EQ("gettable") {
      lua_gettable(L1, getindex);
    }
    else if EQ("gettop") {
      lua_pushinteger(L1, lua_gettop(L1));
    }
    else if EQ("gsub") {
      int a = getnum; int b = getnum; int c = getnum;
      luaL_gsub(L1, lua_tostring(L1, a),
                    lua_tostring(L1, b),
                    lua_tostring(L1, c));
    }
    else if EQ("insert") {
      lua_insert(L1, getnum);
    }
    else if EQ("iscfunction") {
      lua_pushboolean(L1, lua_iscfunction(L1, getindex));
    }
    else if EQ("isfunction") {
      lua_pushboolean(L1, lua_isfunction(L1, getindex));
    }
    else if EQ("isnil") {
      lua_pushboolean(L1, lua_isnil(L1, getindex));
    }
    else if EQ("isnull") {
      lua_pushboolean(L1, lua_isnone(L1, getindex));
    }
    else if EQ("isnumber") {
      lua_pushboolean(L1, lua_isnumber(L1, getindex));
    }
    else if EQ("isstring") {
      lua_pushboolean(L1, lua_isstring(L1, getindex));
    }
    else if EQ("istable") {
      lua_pushboolean(L1, lua_istable(L1, getindex));
    }
    else if EQ("isudataval") {
      lua_pushboolean(L1, lua_islightuserdata(L1, getindex));
    }
    else if EQ("isuserdata") {
      lua_pushboolean(L1, lua_isuserdata(L1, getindex));
    }
    else if EQ("len") {
      lua_len(L1, getindex);
    }
    else if EQ("Llen") {
      lua_pushinteger(L1, luaL_len(L1, getindex));
    }
    else if EQ("loadfile") {
      luaL_loadfile(L1, luaL_checkstring(L1, getnum));
    }
    else if EQ("loadstring") {
      const char *s = luaL_checkstring(L1, getnum);
      luaL_loadstring(L1, s);
    }
    else if EQ("newmetatable") {
      lua_pushboolean(L1, luaL_newmetatable(L1, getstring));
    }
    else if EQ("newtable") {
      lua_newtable(L1);
    }
    else if EQ("newthread") {
      lua_newthread(L1);
    }
    else if EQ("newuserdata") {
      lua_newuserdata(L1, getnum);
    }
    else if EQ("next") {
      lua_next(L1, -2);
    }
    else if EQ("objsize") {
      lua_pushinteger(L1, lua_rawlen(L1, getindex));
    }
    else if EQ("pcall") {
      int narg = getnum;
      int nres = getnum;
      status = lua_pcall(L1, narg, nres, getnum);
    }
    else if EQ("pcallk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      status = lua_pcallk(L1, narg, nres, 0, i, Cfunck);
    }
    else if EQ("pop") {
      lua_pop(L1, getnum);
    }
    else if EQ("printstack") {
      int n = getnum;
      if (n != 0) {
        printf("%s\n", luaL_tolstring(L1, n, NULL));
        lua_pop(L1, 1);
      }
      else printstack(L1);
    }
    else if EQ("print") {
      const char *msg = getstring;
      printf("%s\n", msg);
    }

    else if EQ("pushbool") {
      lua_pushboolean(L1, getnum);
    }
    else if EQ("pushcclosure") {
      lua_pushcclosure(L1, testC, getnum);
    }
    else if EQ("pushint") {
      lua_pushinteger(L1, getnum);
    }
    else if EQ("pushnil") {
      lua_pushnil(L1);
    }
    else if EQ("pushnum") {
      lua_pushnumber(L1, (lua_Number)getnum);
    }
    else if EQ("pushstatus") {
      pushcode(L1, status);
    }
    else if EQ("pushstring") {
      lua_pushstring(L1, getstring);
    }
    else if EQ("pushupvalueindex") {
      lua_pushinteger(L1, lua_upvalueindex(getnum));
    }
    else if EQ("pushvalue") {
      lua_pushvalue(L1, getindex);
    }
    else if EQ("pushfstringI") {
      lua_pushfstring(L1, lua_tostring(L, -2), (int)lua_tointeger(L, -1));
    }
    else if EQ("pushfstringS") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_tostring(L, -1));
    }
    else if EQ("pushfstringP") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_topointer(L, -1));
    }
    else if EQ("rawgeti") {
      int t = getindex;
      lua_rawgeti(L1, t, getnum);
    }
    else if EQ("rawgetp") {
      int t = getindex;
      lua_rawgetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("rawsetp") {
      int t = getindex;
      lua_rawsetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("remove") {
      lua_remove(L1, getnum);
    }
    else if EQ("replace") {
      lua_replace(L1, getindex);
    }
    else if EQ("resume") {
      int i = getindex;
      status = lua_resume(lua_tothread(L1, i), L, getnum);
    }
    else if EQ("return") {
      int n = getnum;
      if (L1 != L) {
        int i;
        for (i = 0; i < n; i++)
          lua_pushstring(L, lua_tostring(L1, -(n - i)));
      }
      return n;
    }
    else if EQ("rotate") {
      int i = getindex;
      lua_rotate(L1, i, getnum);
    }
    else if EQ("setfield") {
      int t = getindex;
      lua_setfield(L1, t, getstring);
    }
    else if EQ("setglobal") {
      lua_setglobal(L1, getstring);
    }
    else if EQ("sethook") {
      int mask = getnum;
      int count = getnum;
      sethookaux(L1, mask, count, getstring);
    }
    else if EQ("setmetatable") {
      lua_setmetatable(L1, getindex);
    }
    else if EQ("settable") {
      lua_settable(L1, getindex);
    }
    else if EQ("settop") {
      lua_settop(L1, getnum);
    }
    else if EQ("testudata") {
      int i = getindex;
      lua_pushboolean(L1, luaL_testudata(L1, i, getstring) != NULL);
    }
    else if EQ("error") {
      lua_error(L1);
    }
    else if EQ("abort") {
      abort();
    }
    else if EQ("throw") {
#if defined(__cplusplus)
static struct X { int x; } x;
      throw x;
#else
      luaL_error(L1, "C++");
#endif
      break;
    }
    else if EQ("tobool") {
      lua_pushboolean(L1, lua_toboolean(L1, getindex));
    }
    else if EQ("tocfunction") {
      lua_pushcfunction(L1, lua_tocfunction(L1, getindex));
    }
    else if EQ("tointeger") {
      lua_pushinteger(L1, lua_tointeger(L1, getindex));
    }
    else if EQ("tonumber") {
      lua_pushnumber(L1, lua_tonumber(L1, getindex));
    }
    else if EQ("topointer") {
      lua_pushnumber(L1, cast(size_t, lua_topointer(L1, getindex)));
    }
    else if EQ("tostring") {
      const char *s = lua_tostring(L1, getindex);
      const char *s1 = lua_pushstring(L1, s);
      lua_longassert((s == NULL && s1 == NULL) || strcmp(s, s1) == 0);
    }
    else if EQ("type") {
      lua_pushstring(L1, luaL_typename(L1, getnum));
    }
    else if EQ("xmove") {
      int f = getindex;
      int t = getindex;
      lua_State *fs = (f == 0) ? L1 : lua_tothread(L1, f);
      lua_State *ts = (t == 0) ? L1 : lua_tothread(L1, t);
      int n = getnum;
      if (n == 0) n = lua_gettop(fs);
      lua_xmove(fs, ts, n);
    }
    else if EQ("yield") {
      return lua_yield(L1, getnum);
    }
    else if EQ("yieldk") {
      int nres = getnum;
      int i = getindex;
      return lua_yieldk(L1, nres, i, Cfunck);
    }
    else luaL_error(L, "unknown instruction %s", buff);
  }
  return 0;
}